

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O2

void __thiscall
QPDFJob::addOutlinesToJson
          (QPDFJob *this,
          vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_> *outlines,
          JSON *j,map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
                  *page_numbers)

{
  bool bVar1;
  size_type sVar2;
  int json_version;
  pointer this_00;
  longlong in_stack_fffffffffffffec0;
  JSON j_kids;
  JSON j_destpage;
  JSON jo;
  QPDFObjectHandle page;
  __shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2> local_d8 [2];
  JSON *local_b8;
  pointer local_b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  JSON local_98;
  JSON local_88;
  JSON local_78;
  JSON local_68;
  JSON local_58;
  vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_> local_48;
  
  local_b0 = (outlines->
             super__Vector_base<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>).
             _M_impl.super__Vector_impl_data._M_finish;
  local_b8 = j;
  for (this_00 = (outlines->
                 super__Vector_base<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>
                 )._M_impl.super__Vector_impl_data._M_start; this_00 != local_b0;
      this_00 = this_00 + 1) {
    JSON::makeDictionary();
    JSON::addArrayElement(&jo,local_b8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d8[0]._M_refcount);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_d8,"object",(allocator<char> *)&j_kids);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&j_destpage,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
               &(this_00->super_QPDFObjectHelper).super_BaseHandle);
    json_version = (int)(QPDFOutlineObjectHelper *)&j_destpage;
    QPDFObjectHandle::getJSON
              (&page,json_version,
               SUB41(((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->json_version,0));
    JSON::addDictionaryMember(&local_58,(string *)&jo,(JSON *)local_d8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_58.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&page.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&j_destpage.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__cxx11::string::~string((string *)local_d8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_d8,"title",(allocator<char> *)&j_kids);
    QPDFOutlineObjectHelper::getTitle_abi_cxx11_((string *)&page,this_00);
    JSON::makeString((string *)&j_destpage);
    JSON::addDictionaryMember(&local_68,(string *)&jo,(JSON *)local_d8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_68.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&j_destpage.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__cxx11::string::~string((string *)&page);
    std::__cxx11::string::~string((string *)local_d8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_d8,"dest",(allocator<char> *)&j_kids);
    QPDFOutlineObjectHelper::getDest((QPDFOutlineObjectHelper *)&j_destpage);
    QPDFObjectHandle::getJSON
              (&page,json_version,
               SUB41(((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->json_version,0));
    JSON::addDictionaryMember(&local_78,(string *)&jo,(JSON *)local_d8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_78.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&page.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&j_destpage.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__cxx11::string::~string((string *)local_d8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_d8,"open",(allocator<char> *)&j_destpage);
    QPDFOutlineObjectHelper::getCount(this_00);
    JSON::makeBool(false);
    JSON::addDictionaryMember(&local_88,(string *)&jo,(JSON *)local_d8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_88.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&page.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__cxx11::string::~string((string *)local_d8);
    QPDFOutlineObjectHelper::getDestPage((QPDFOutlineObjectHelper *)&page);
    JSON::makeNull();
    bVar1 = QPDFObjectHandle::isIndirect(&page);
    if (bVar1) {
      j_kids.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)QPDFObjectHandle::getObjGen(&page);
      sVar2 = std::
              map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
              ::count(page_numbers,(key_type *)&j_kids);
      if (sVar2 != 0) {
        std::
        map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
        ::operator[](page_numbers,(key_type *)&j_kids);
        JSON::makeInt(in_stack_fffffffffffffec0);
        std::__shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2> *)&j_destpage,local_d8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d8[0]._M_refcount);
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_d8,"destpageposfrom1",(allocator<char> *)&j_kids);
    JSON::addDictionaryMember(&local_98,(string *)&jo,(JSON *)local_d8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_98.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::__cxx11::string::~string((string *)local_d8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_d8,"kids",(allocator<char> *)&stack0xfffffffffffffec7);
    JSON::makeArray();
    JSON::addDictionaryMember(&j_kids,(string *)&jo,(JSON *)local_d8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0);
    std::__cxx11::string::~string((string *)local_d8);
    QPDFOutlineObjectHelper::getKids(&local_48,this_00);
    addOutlinesToJson(this,&local_48,&j_kids,page_numbers);
    std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>::~vector
              (&local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&j_kids.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&j_destpage.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&page.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&jo.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  return;
}

Assistant:

void
QPDFJob::addOutlinesToJson(
    std::vector<QPDFOutlineObjectHelper> outlines, JSON& j, std::map<QPDFObjGen, int>& page_numbers)
{
    for (auto& ol: outlines) {
        JSON jo = j.addArrayElement(JSON::makeDictionary());
        jo.addDictionaryMember("object", ol.getObjectHandle().getJSON(m->json_version));
        jo.addDictionaryMember("title", JSON::makeString(ol.getTitle()));
        jo.addDictionaryMember("dest", ol.getDest().getJSON(m->json_version, true));
        jo.addDictionaryMember("open", JSON::makeBool(ol.getCount() >= 0));
        QPDFObjectHandle page = ol.getDestPage();
        JSON j_destpage = JSON::makeNull();
        if (page.isIndirect()) {
            QPDFObjGen og = page.getObjGen();
            if (page_numbers.count(og)) {
                j_destpage = JSON::makeInt(page_numbers[og]);
            }
        }
        jo.addDictionaryMember("destpageposfrom1", j_destpage);
        JSON j_kids = jo.addDictionaryMember("kids", JSON::makeArray());
        addOutlinesToJson(ol.getKids(), j_kids, page_numbers);
    }
}